

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sumFinalize(sqlite3_context *context)

{
  int iVar1;
  sqlite3_context *pCtx;
  double in_RDI;
  SumCtx *p;
  sqlite3_context *in_stack_ffffffffffffffe8;
  
  pCtx = (sqlite3_context *)sqlite3_aggregate_context(in_stack_ffffffffffffffe8,0);
  if ((pCtx != (sqlite3_context *)0x0) && (0 < (long)pCtx->pVdbe)) {
    if ((char)pCtx->iOp == '\0') {
      sqlite3_result_int64(pCtx,(i64)in_stack_ffffffffffffffe8);
    }
    else if (*(char *)((long)&pCtx->iOp + 1) == '\0') {
      iVar1 = sqlite3IsOverflow(in_RDI);
      if (iVar1 == 0) {
        sqlite3_result_double(pCtx,(double)in_stack_ffffffffffffffe8);
      }
      else {
        sqlite3_result_double(pCtx,(double)in_stack_ffffffffffffffe8);
      }
    }
    else {
      sqlite3_result_error(pCtx,(char *)in_stack_ffffffffffffffe8,0);
    }
  }
  return;
}

Assistant:

static void sumFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  if( p && p->cnt>0 ){
    if( p->approx ){
      if( p->ovrfl ){
        sqlite3_result_error(context,"integer overflow",-1);
      }else if( !sqlite3IsOverflow(p->rErr) ){
        sqlite3_result_double(context, p->rSum+p->rErr);
      }else{
        sqlite3_result_double(context, p->rSum);
      }
    }else{
      sqlite3_result_int64(context, p->iSum);
    }
  }
}